

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void dwt_calc_explicit_stepsizes(opj_tccp_t *tccp,int prec)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  
  OVar1 = tccp->numresolutions;
  uVar6 = OVar1 * 3 - 2;
  if (0 < (int)uVar6) {
    OVar2 = tccp->qmfbid;
    OVar3 = tccp->qntsty;
    uVar11 = 0;
    do {
      uVar7 = 0;
      if (uVar11 == 0) {
        iVar8 = 0;
      }
      else {
        uVar7 = ~(((int)uVar11 + -1) / 3);
        iVar8 = ((int)uVar11 + -1) % 3 + 1;
      }
      iVar5 = 2 - (uint)(iVar8 - 1U < 2);
      if (iVar8 == 0) {
        iVar5 = 0;
      }
      if (OVar2 == 0) {
        iVar5 = 0;
      }
      dVar12 = 8192.0;
      if (OVar3 != 0) {
        dVar12 = (double)(0x2000 << ((byte)iVar5 & 0x1f)) /
                 dwt_norms_real[iVar8][(int)(uVar7 + (OVar1 - 1))];
      }
      dVar12 = floor(dVar12);
      uVar7 = (uint)dVar12;
      iVar9 = 0;
      iVar8 = 0;
      if (1 < (int)uVar7) {
        iVar8 = 0;
        uVar10 = uVar7;
        do {
          iVar8 = iVar8 + -1;
          bVar4 = 3 < uVar10;
          uVar10 = uVar10 >> 1;
        } while (bVar4);
      }
      if (1 < (int)uVar7) {
        iVar9 = 0;
        uVar10 = uVar7;
        do {
          iVar9 = iVar9 + 1;
          bVar4 = 3 < uVar10;
          uVar10 = uVar10 >> 1;
        } while (bVar4);
      }
      uVar10 = uVar7 << (0xbU - (char)iVar9 & 0x1f);
      if (0xb < iVar9) {
        uVar10 = (int)uVar7 >> ((char)iVar9 - 0xbU & 0x1f);
      }
      tccp->stepsizes[uVar11].mant = uVar10 & 0x7ff;
      tccp->stepsizes[uVar11].expn = iVar5 + prec + 0xd + iVar8;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar6);
  }
  return;
}

Assistant:

void dwt_calc_explicit_stepsizes(opj_tccp_t * tccp, int prec) {
	int numbands, bandno;
	numbands = 3 * tccp->numresolutions - 2;
	for (bandno = 0; bandno < numbands; bandno++) {
		double stepsize;
		int resno, level, orient, gain;

		resno = (bandno == 0) ? 0 : ((bandno - 1) / 3 + 1);
		orient = (bandno == 0) ? 0 : ((bandno - 1) % 3 + 1);
		level = tccp->numresolutions - 1 - resno;
		gain = (tccp->qmfbid == 0) ? 0 : ((orient == 0) ? 0 : (((orient == 1) || (orient == 2)) ? 1 : 2));
		if (tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
			stepsize = 1.0;
		} else {
			double norm = dwt_norms_real[orient][level];
			stepsize = (1 << (gain)) / norm;
		}
		dwt_encode_stepsize((int) floor(stepsize * 8192.0), prec + gain, &tccp->stepsizes[bandno]);
	}
}